

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

QList<QString> *
waitForValue<QList<QString>>
          (QList<QString> *__return_storage_ptr__,QPromise<QList<QString>_> *promise,
          QList<QString> *initial)

{
  QSharedData *pQVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  PromiseDataBase<void,_void_()> *this;
  QList<QString> *pQVar5;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  QPromiseReject<void> *in_R8;
  PromiseData<QList<QString>_> *pPVar6;
  QSharedData *pQVar7;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_c0;
  Data *local_b8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_b0;
  Data *local_a8;
  Data *pDStack_a0;
  QList<QString> *local_98;
  QPromise<void> local_88;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  undefined7 extraout_var;
  
  pDVar2 = (initial->d).d;
  (__return_storage_ptr__->d).d = pDVar2;
  (__return_storage_ptr__->d).ptr = (initial->d).ptr;
  (__return_storage_ptr__->d).size = (initial->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  this->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this->super_QSharedData = 0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this->m_lock = 0;
  *(undefined8 *)&this->m_settled = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_001542c0;
  QReadWriteLock::QReadWriteLock(&this->m_lock,0);
  this->m_settled = false;
  (this->m_handlers).d.d = (Data *)0x0;
  (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this->m_handlers).d.size = 0;
  (this->m_catchers).d.d = (Data *)0x0;
  (this->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this->m_catchers).d.size = 0;
  (this->m_error).m_data._M_exception_object = (void *)0x0;
  this->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00154258;
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar7 = &this->super_QSharedData;
  local_88.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001541f0;
  local_88.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)this;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_b0,&local_88);
  local_88.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00154238;
  if (&(local_88.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = &((local_88.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (&(local_88.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()> !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (*((local_88.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (local_b0.d == (Data *)0x0) {
    pPVar6 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
    local_a8 = (Data *)0x0;
    pDStack_a0 = (Data *)0x0;
    goto LAB_0010ea7d;
  }
  LOCK();
  ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (local_b0.d == (Data *)0x0) {
    local_c0.d = (Data *)0x0;
    pPVar6 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
LAB_0010ea68:
    local_a8 = local_b0.d;
    LOCK();
    ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDStack_a0 = local_c0.d;
    if (local_c0.d == (Data *)0x0) goto LAB_0010ea7d;
  }
  else {
    LOCK();
    ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_c0.d = local_b0.d;
    pPVar6 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
    if (local_b0.d != (Data *)0x0) goto LAB_0010ea68;
  }
  local_a8 = local_b0.d;
  LOCK();
  ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
       super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pDStack_a0 = local_c0.d;
LAB_0010ea7d:
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_c0.d = pDStack_a0;
  local_b8 = local_a8;
  local_98 = __return_storage_ptr__;
  local_78._M_unused._M_object = operator_new(0x18);
  *(Data **)local_78._M_unused._0_8_ = local_a8;
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 8) = pDStack_a0;
  if (pDStack_a0 == (Data *)0x0) {
    *(QList<QString> **)((long)local_78._M_unused._0_8_ + 0x10) = local_98;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (pDStack_a0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (pDStack_a0->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QList<QString> **)((long)local_78._M_unused._0_8_ + 0x10) = local_98;
    pcStack_60 = std::
                 _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_QList<QString>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_manager;
    if (pDStack_a0 != (Data *)0x0) {
      LOCK();
      (pDStack_a0->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pDStack_a0->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDStack_a0->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pDStack_a0,0x10);
      }
    }
  }
  if (local_a8 != (Data *)0x0) {
    LOCK();
    (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_a8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addHandler
            (&pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QList<QString>_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  pPVar6 = (promise->super_QPromiseBase<QList<QString>_>).m_d.d;
  QtPromisePrivate::PromiseCatcher<QList<QString>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QList<QString>,decltype(nullptr),void> *)0x0,&local_b8,
             (QPromiseResolve<void> *)&local_c0,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::addCatcher
            (&pPVar6->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_c0.d != (Data *)0x0) {
    LOCK();
    ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_c0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_c0.d,0x10);
    }
  }
  if (local_b8 != (Data *)0x0) {
    LOCK();
    (local_b8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (local_b8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_b8,0x10);
    }
  }
  if (local_b0.d != (Data *)0x0) {
    LOCK();
    ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_b0.d,0x10);
    }
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::
          isPending(&((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                     super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::dispatch
              (&((promise->super_QPromiseBase<QList<QString>_>).m_d.d)->
                super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this);
  pQVar5 = (QList<QString> *)CONCAT71(extraout_var,bVar3);
  while ((char)pQVar5 != '\0') {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this);
    pQVar5 = (QList<QString> *)CONCAT71(extraout_var_00,bVar3);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    iVar4 = (*this->_vptr_PromiseDataBase[1])(this);
    pQVar5 = (QList<QString> *)CONCAT44(extraout_var_01,iVar4);
  }
  LOCK();
  (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar7->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    iVar4 = (*this->_vptr_PromiseDataBase[1])(this);
    pQVar5 = (QList<QString> *)CONCAT44(extraout_var_02,iVar4);
  }
  return pQVar5;
}

Assistant:

static inline T waitForValue(const QtPromise::QPromise<T>& promise, const T& initial)
{
    T value(initial);
    promise
        .then([&](const T& res) {
            value = res;
        })
        .wait();
    return value;
}